

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

pair<const_char_*,_unsigned_int> google::protobuf::internal::VarintParseSlow32(char *p,uint32_t res)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  
  uVar6 = (res + (uint)(byte)p[1] * 0x80) - 0x80;
  if (p[1] < '\0') {
    bVar4 = 0xe;
    uVar5 = 0;
    do {
      uVar3 = uVar5;
      if (uVar3 == 3) {
        pcVar2 = (char *)0x4;
        bVar8 = true;
        goto LAB_00227aa6;
      }
      uVar6 = uVar6 + ((byte)p[uVar3 + 2] - 1 << (bVar4 & 0x1f));
      bVar4 = bVar4 + 7;
      uVar5 = uVar3 + 1;
    } while (p[uVar3 + 2] < '\0');
    bVar8 = 3 < uVar3 + 1;
    lVar1 = uVar3 + 2;
  }
  else {
    lVar1 = 1;
    bVar8 = false;
  }
  pcVar2 = p + lVar1 + 1;
LAB_00227aa6:
  if (bVar8) {
    lVar1 = 5;
    uVar5 = 0;
    pcVar7 = p + 6;
    do {
      pcVar2 = pcVar7;
      if (-1 < pcVar2[-1]) goto LAB_00227acd;
      pcVar7 = pcVar2 + 1;
      pcVar2 = (char *)0x0;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  else {
LAB_00227acd:
    uVar5 = (ulong)uVar6;
  }
  pVar9._8_8_ = uVar5;
  pVar9.first = pcVar2;
  return pVar9;
}

Assistant:

std::pair<const char*, uint32_t> VarintParseSlow32(const char* p,
                                                   uint32_t res) {
  for (std::uint32_t i = 1; i < 5; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (ABSL_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  // Accept >5 bytes
  for (std::uint32_t i = 5; i < 10; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    if (ABSL_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}